

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

int __thiscall
Js::ByteCodeWriter::Reg2Aux
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,void *buffer,int byteCount,int C1)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  uint local_50;
  int local_4c;
  OpLayoutReg2Aux data;
  
  data._8_8_ = buffer;
  CheckOpen(this);
  if (R0 != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_008a3aac;
      *puVar5 = 0;
    }
    RVar4 = FunctionBody::MapRegSlot(this->m_functionWrite,R0);
    if (R1 != 0xffffffff) {
      if (this->m_functionWrite != (FunctionBody *)0x0) {
LAB_008a39de:
        data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.C1 =
             FunctionBody::MapRegSlot(this->m_functionWrite,R1);
        uVar1 = (this->m_auxiliaryData).currentOffset;
        if (byteCount != 0) {
          Data::Encode(&this->m_auxiliaryData,(void *)data._8_8_,byteCount);
        }
        local_4c = C1;
        local_50 = uVar1;
        data.super_OpLayoutAuxiliary.super_OpLayoutAuxNoReg.Offset = RVar4;
        Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
        Data::Write(&this->m_byteCodeData,&local_50,0x10);
        return uVar1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (bVar3) {
        *puVar5 = 0;
        goto LAB_008a39de;
      }
      goto LAB_008a3aac;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar3) {
    *puVar5 = 0;
    Throw::InternalError();
  }
LAB_008a3aac:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

int ByteCodeWriter::Reg2Aux(OpCode op, RegSlot R0, RegSlot R1, const void* buffer, int byteCount, int C1)
    {
        CheckOpen();
        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        //
        // Write the buffer's contents
        //

        int currentOffset   = InsertAuxiliaryData(buffer, byteCount);

        //
        // Write OpCode to create new auxiliary data
        //

        OpLayoutReg2Aux data;
        data.R0 = R0;
        data.R1 = R1;
        data.Offset = currentOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);

        return currentOffset;
    }